

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::decompressTextureLevel
               (TexDecompressionParams *params,ArrayBuffer<unsigned_char,_1UL,_1UL> *levelData,
               PixelBufferAccess *levelAccess,CompressedTexFormat *compressedFormat,
               TextureFormat *decompressedFormat,IVec3 *levelPixelSize,void *data)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  PixelBufferAccess local_58;
  
  iVar1 = levelPixelSize->m_data[1];
  iVar2 = levelPixelSize->m_data[0];
  iVar3 = levelPixelSize->m_data[2];
  iVar4 = tcu::TextureFormat::getPixelSize(decompressedFormat);
  de::ArrayBuffer<unsigned_char,_1UL,_1UL>::setStorage
            (levelData,(long)(iVar4 * iVar1 * iVar2 * iVar3));
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_58,decompressedFormat,levelPixelSize->m_data[0],levelPixelSize->m_data[1],
             levelPixelSize->m_data[2],levelData->m_ptr);
  (levelAccess->super_ConstPixelBufferAccess).m_data = local_58.super_ConstPixelBufferAccess.m_data;
  *(undefined8 *)((levelAccess->super_ConstPixelBufferAccess).m_size.m_data + 2) =
       local_58.super_ConstPixelBufferAccess._16_8_;
  *(undefined8 *)((levelAccess->super_ConstPixelBufferAccess).m_pitch.m_data + 1) =
       local_58.super_ConstPixelBufferAccess.m_pitch.m_data._4_8_;
  (levelAccess->super_ConstPixelBufferAccess).m_format =
       local_58.super_ConstPixelBufferAccess.m_format;
  *(undefined8 *)(levelAccess->super_ConstPixelBufferAccess).m_size.m_data =
       local_58.super_ConstPixelBufferAccess.m_size.m_data._0_8_;
  tcu::decompress(levelAccess,*compressedFormat,(deUint8 *)data,params);
  return;
}

Assistant:

void decompressTextureLevel (const tcu::TexDecompressionParams&		params,
							 ArrayBuffer<deUint8>&					levelData,
							 tcu::PixelBufferAccess&				levelAccess,
							 const tcu::CompressedTexFormat&		compressedFormat,
							 const tcu::TextureFormat&				decompressedFormat,
							 const IVec3&							levelPixelSize,
							 const void*							data)
{
	levelData.setStorage(levelPixelSize.x() * levelPixelSize.y() * levelPixelSize.z() * decompressedFormat.getPixelSize());
	levelAccess = tcu::PixelBufferAccess(decompressedFormat, levelPixelSize.x(), levelPixelSize.y(), levelPixelSize.z(), levelData.getPtr());

	tcu::decompress(levelAccess, compressedFormat, (const deUint8*)data, params);
}